

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
               (string *s,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,bool *args,
               bool *args_1,bool *args_2,bool *args_3,optional<int> *args_4,optional<int> *args_5,
               bool *args_6,bool *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_11,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_12,
               optional<pbrt::Bounds2<float>_> *args_13,optional<pbrt::Bounds2<int>_> *args_14,
               optional<pbrt::Point2<int>_> *args_15,float *args_16)

{
  long lVar1;
  ulong uVar2;
  bool *unaff_RBP;
  string *in_RDI;
  bool *unaff_retaddr;
  bool *in_stack_00000008;
  bool *in_stack_00000010;
  char *in_stack_00000018;
  string *in_stack_00000020;
  optional<int> *in_stack_00000060;
  optional<int> *in_stack_00000068;
  bool *in_stack_00000070;
  bool *in_stack_00000078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a0;
  optional<pbrt::Bounds2<float>_> *in_stack_000000a8;
  optional<pbrt::Bounds2<int>_> *in_stack_000000b0;
  optional<pbrt::Point2<int>_> *in_stack_000000b8;
  float *in_stack_000000c0;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffd00;
  char **in_stack_fffffffffffffd08;
  char **in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  string local_288 [16];
  char *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  LogLevel in_stack_fffffffffffffda4;
  string local_240 [32];
  stringstream local_220 [413];
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [72];
  string *local_38;
  
  local_38 = in_RDI;
  copyToFormatString(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
             in_stack_fffffffffffffd88);
  }
  if ((bool)local_83) {
    LogFatal(in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
             in_stack_fffffffffffffd88);
  }
  if ((local_82 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
               in_stack_fffffffffffffd88);
    }
    std::__cxx11::string::c_str();
    formatOne<std::__cxx11::string_const&>(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    std::__cxx11::string::operator+=(local_38,local_288);
    std::__cxx11::string::~string(local_288);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_220);
    operator<<((ostream *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__cxx11::string::operator+=(local_38,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             unaff_RBP,in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,
             in_stack_00000080,in_stack_00000088,in_stack_00000090,in_stack_00000098,
             in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,
             in_stack_000000c0);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}